

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

fdb_status filemgr_sync(filemgr *file,bool sync_option,err_log_callback *log_callback)

{
  __int_type _Var1;
  fdb_status io_error;
  char *what;
  filemgr_ops *ops;
  char *filename;
  
  _Var1 = (file->pos).super___atomic_base<unsigned_long>._M_i;
  if ((global_config.ncacheblock < 1) ||
     (io_error = bcache_flush(file), io_error == FDB_RESULT_SUCCESS)) {
    if ((!sync_option) || ((file->fflags & 1) == 0)) {
      LOCK();
      (file->latest_filesize).super___atomic_base<unsigned_long>._M_i = _Var1;
      UNLOCK();
      return FDB_RESULT_SUCCESS;
    }
    io_error = (*file->ops->fsync)(file->fd);
    filename = file->filename;
    ops = file->ops;
    what = "FSYNC";
  }
  else {
    filename = file->filename;
    ops = file->ops;
    what = "FLUSH";
  }
  _log_errno_str(ops,log_callback,io_error,what,filename);
  return io_error;
}

Assistant:

fdb_status filemgr_sync(struct filemgr *file, bool sync_option,
                        err_log_callback *log_callback)
{
    fdb_status result = FDB_RESULT_SUCCESS;
    uint64_t exp_filesize = atomic_get_uint64_t(&file->pos);
    if (global_config.ncacheblock > 0) {
        result = bcache_flush(file);
        if (result != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, (fdb_status) result,
                           "FLUSH", file->filename);
            return result;
        }
    }

    if (sync_option && file->fflags & FILEMGR_SYNC) {
        int rv = file->ops->fsync(file->fd);
        _log_errno_str(file->ops, log_callback, (fdb_status)rv, "FSYNC", file->filename);
        return (fdb_status) rv;
    }
    atomic_init_uint64_t(&file->latest_filesize, exp_filesize);

    return result;
}